

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingBoostTypes.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  cx_string<2UL> cVar3;
  SessionWriter *pSVar4;
  __atomic_base<unsigned_long> _Var5;
  nanoseconds nVar6;
  int *p;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  initializer_list<int> il;
  initializer_list<int> il_00;
  initializer_list<int> il_01;
  initializer_list<std::pair<const_int,_int>_> il_02;
  initializer_list<int> il_03;
  initializer_list<std::pair<int,_int>_> il_04;
  initializer_list<int> il_05;
  cx_string<8UL> cVar7;
  cx_string<14UL> cVar8;
  allocator local_5fc;
  allocator local_5fb;
  allocator local_5fa;
  allocator local_5f9;
  optional<int> bopt;
  allocator local_5e9;
  scoped_ptr<int> bscoped;
  optional<int> bemptyOpt;
  shared_ptr<int> bshared;
  ConsumeResult local_5c8;
  set<int,_std::less<int>,_void,_void> bs;
  slist<int,_void> bsl;
  string str;
  map<int,_int,_std::less<int>,_void,_void> bm;
  vector<int,_void,_void> bv;
  flat_map<int,_int,_std::less<int>,_void> bfm;
  flat_set<int,_std::less<int>,_void> bfs;
  list<int,_void> bl;
  deque<int,_void,_void> bdq;
  undefined1 local_480 [48];
  string local_450 [32];
  string local_430 [32];
  uint64_t local_410;
  string local_408 [32];
  string local_3e8 [32];
  undefined1 local_3c8 [48];
  string local_398 [32];
  string local_378 [32];
  uint64_t local_358;
  string local_350 [32];
  string local_330 [32];
  undefined1 local_310 [48];
  string local_2e0 [32];
  string local_2c0 [32];
  uint64_t local_2a0;
  string local_298 [32];
  string local_278 [32];
  undefined1 local_258 [48];
  string local_228 [32];
  string local_208 [32];
  uint64_t local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  undefined1 local_1a0 [48];
  string local_170 [32];
  string local_150 [32];
  uint64_t local_130;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  uint64_t local_78;
  string local_70 [32];
  string local_50 [32];
  
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = 0x200000001;
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_._0_4_ = 3;
  il._M_len = 3;
  il._M_array = (iterator)&bm;
  boost::container::deque<int,_void,_void>::deque(&bdq,il,(allocator_type *)&bs);
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = 0x800000007;
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_._0_4_ = 9;
  il_00._M_len = 3;
  il_00._M_array = (iterator)&bm;
  boost::container::list<int,_void>::list(&bl,il_00,(ValueAllocator *)&bs);
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = 0x140000000a;
  bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_._0_4_ = 0x1e;
  il_01._M_len = 3;
  il_01._M_array = (iterator)&bm;
  boost::container::slist<int,_void>::slist(&bsl,il_01,(allocator_type *)&bs);
  bv.m_holder.m_start = (pointer)0x0;
  bv.m_holder.m_size = 0;
  bv.m_holder.m_capacity = 0;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e8 + 0x10),"main",(allocator *)&bs);
      std::__cxx11::string::string(local_b8,"main",(allocator *)&local_5c8);
      std::__cxx11::string::string
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,(allocator *)&bfm);
      local_78 = 0x26;
      std::__cxx11::string::string
                (local_70,"Boost sequence containers: {} {} {} {}",(allocator *)&bfs);
      cVar7 = binlog::detail::
              concatenated_tags<char_const(&)[39],boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
                        ((char (*) [39])"Boost sequence containers: {} {} {} {}",&bdq,&bl,&bsl,&bv);
      bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
      super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
      .m_icont.
      super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .super_size_holder<true,_unsigned_long,_void>.size_ = cVar7._data._0_8_;
      bm.super_tree<std::pair<const_int,_int>,_int,_std::less<int>,_void,_void>.
      super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
      .m_icont.
      super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
      .
      super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
      .holder.root.super_node.parent_._0_1_ = cVar7._data[8];
      std::__cxx11::string::string(local_50,(char *)&bm,(allocator *)&str);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e8);
      binlog::EventSource::~EventSource((EventSource *)local_e8);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::
    addEvent<boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&bdq,&bl,
               &bsl,&bv);
  }
  bs.super_tree<int,_void,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = 0x100000001;
  bs.super_tree<int,_void,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)0x400000002;
  bs.super_tree<int,_void,_std::less<int>,_void,_void>.
  super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  .m_icont.
  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.left_ = (node_ptr)0x900000003;
  il_02._M_len = 3;
  il_02._M_array = (iterator)&bs;
  boost::container::map<int,_int,_std::less<int>,_void,_void>::map(&bm,il_02);
  local_5c8.bytesConsumed._0_2_ = 4;
  local_5c8.bytesConsumed._2_1_ = 0;
  local_5c8.bytesConsumed._3_5_ = 0x500;
  local_5c8.totalBytesConsumed._0_4_ = 6;
  il_03._M_len = 3;
  il_03._M_array = (iterator)&local_5c8;
  boost::container::set<int,_std::less<int>,_void,_void>::set(&bs,il_03);
  local_5c8.bytesConsumed._0_2_ = 1;
  local_5c8.bytesConsumed._2_1_ = 0;
  local_5c8.bytesConsumed._3_5_ = 0x100;
  local_5c8.totalBytesConsumed._0_4_ = 2;
  local_5c8.totalBytesConsumed._4_2_ = 4;
  local_5c8.totalBytesConsumed._6_1_ = 0;
  local_5c8.totalBytesConsumed._7_1_ = 0;
  local_5c8.channelsPolled = 0x900000003;
  il_04._M_len = 3;
  il_04._M_array = (iterator)&local_5c8;
  boost::container::flat_map<int,_int,_std::less<int>,_void>::flat_map(&bfm,il_04);
  local_5c8.bytesConsumed._0_2_ = 2;
  local_5c8.bytesConsumed._2_1_ = '\0';
  local_5c8.bytesConsumed._3_5_ = 0x300;
  local_5c8.totalBytesConsumed._0_4_ = 5;
  local_5c8.totalBytesConsumed._4_2_ = 8;
  local_5c8.totalBytesConsumed._6_1_ = '\0';
  local_5c8.totalBytesConsumed._7_1_ = 0;
  il_05._M_len = 4;
  il_05._M_array = (iterator)&local_5c8;
  boost::container::flat_set<int,_std::less<int>,_void>::flat_set(&bfs,il_05);
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_1a0 + 0x10),"main",(allocator *)&str);
      std::__cxx11::string::string(local_170,"main",(allocator *)&bshared);
      std::__cxx11::string::string
                (local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,(allocator *)&bscoped);
      local_130 = 0x2d;
      std::__cxx11::string::string
                (local_128,"Boost associative containers: {} {} {} {}",(allocator *)&bopt);
      cVar8 = binlog::detail::
              concatenated_tags<char_const(&)[42],boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
                        ((char (*) [42])"Boost associative containers: {} {} {} {}",&bm,&bs,&bfm,
                         &bfs);
      local_5c8.bytesConsumed._0_2_ = cVar8._data._0_2_;
      local_5c8.bytesConsumed._2_1_ = cVar8._data[2];
      local_5c8.bytesConsumed._3_5_ = cVar8._data._3_5_;
      local_5c8.totalBytesConsumed._0_4_ = cVar8._data._8_4_;
      local_5c8.totalBytesConsumed._6_1_ = cVar8._data[0xe];
      local_5c8.totalBytesConsumed._4_2_ = cVar8._data._12_2_;
      std::__cxx11::string::string(local_108,(char *)&local_5c8,(allocator *)&bemptyOpt);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1a0);
      binlog::EventSource::~EventSource((EventSource *)local_1a0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::
    addEvent<boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&bm,&bs,&bfm
               ,&bfs);
  }
  boost::container::basic_string<char,_std::char_traits<char>,_void>::basic_string(&str,"foo");
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_258._0_8_ = 0;
      local_258._8_2_ = info;
      std::__cxx11::string::string((string *)(local_258 + 0x10),"main",(allocator *)&bshared);
      std::__cxx11::string::string(local_228,"main",(allocator *)&bscoped);
      std::__cxx11::string::string
                (local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,(allocator *)&bopt);
      local_1e8 = 0x33;
      std::__cxx11::string::string(local_1e0,"Boost string: {}",(allocator *)&bemptyOpt);
      cVar3 = binlog::detail::
              concatenated_tags<char_const(&)[17],boost::container::basic_string<char,std::char_traits<char>,void>&>
                        ((char (*) [17])"Boost string: {}",&str);
      local_5c8.bytesConsumed._0_2_ = cVar3._data._0_2_;
      local_5c8.bytesConsumed._2_1_ = cVar3._data[2];
      std::__cxx11::string::string(local_1c0,(char *)&local_5c8,&local_5fc);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_258);
      binlog::EventSource::~EventSource((EventSource *)local_258);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::
    addEvent<boost::container::basic_string<char,std::char_traits<char>,void>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&str);
  }
  bscoped.px = (int *)operator_new(4);
  *bscoped.px = 1;
  p = (int *)operator_new(4);
  *p = 2;
  boost::shared_ptr<int>::shared_ptr<int>(&bshared,p);
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_310._0_8_ = 0;
      local_310._8_2_ = info;
      std::__cxx11::string::string((string *)(local_310 + 0x10),"main",(allocator *)&bopt);
      std::__cxx11::string::string(local_2e0,"main",(allocator *)&bemptyOpt);
      std::__cxx11::string::string
                (local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_5fc);
      local_2a0 = 0x3a;
      std::__cxx11::string::string(local_298,"Boost pointers: {} {}",&local_5fa);
      cVar7 = binlog::detail::
              concatenated_tags<char_const(&)[22],boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
                        ((char (*) [22])0x12817a,&bscoped,&bshared);
      local_5c8.bytesConsumed._0_2_ = cVar7._data._0_2_;
      local_5c8.bytesConsumed._2_1_ = cVar7._data[2];
      local_5c8.bytesConsumed._3_5_ = cVar7._data._3_5_;
      local_5c8.totalBytesConsumed._0_1_ = cVar7._data[8];
      std::__cxx11::string::string(local_278,(char *)&local_5c8,&local_5fb);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_310);
      binlog::EventSource::~EventSource((EventSource *)local_310);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&bscoped,
               &bshared);
  }
  boost::shared_ptr<int>::reset(&bshared);
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_3c8._0_8_ = 0;
      local_3c8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_3c8 + 0x10),"main",(allocator *)&bemptyOpt);
      std::__cxx11::string::string(local_398,"main",&local_5fc);
      std::__cxx11::string::string
                (local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_5fa);
      local_358 = 0x3e;
      std::__cxx11::string::string(local_350,"Empty Boost pointers: {} {}",&local_5fb);
      bopt.super_type.m_initialized = false;
      bopt.super_type._1_3_ = 0;
      bopt.super_type.m_storage = 0;
      cVar7 = binlog::detail::
              concatenated_tags<char_const(&)[28],boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
                        ((char (*) [28])"Empty Boost pointers: {} {}",(scoped_ptr<bool> *)&bopt,
                         &bshared);
      local_5c8.bytesConsumed._0_2_ = cVar7._data._0_2_;
      local_5c8.bytesConsumed._2_1_ = cVar7._data[2];
      local_5c8.bytesConsumed._3_5_ = cVar7._data._3_5_;
      local_5c8.totalBytesConsumed._0_1_ = cVar7._data[8];
      std::__cxx11::string::string(local_330,(char *)&local_5c8,&local_5f9);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_3c8);
      binlog::EventSource::~EventSource((EventSource *)local_3c8);
      boost::checked_delete<bool>((bool *)bopt.super_type);
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    local_5c8.bytesConsumed._0_2_ = 0;
    local_5c8.bytesConsumed._2_1_ = '\0';
    local_5c8.bytesConsumed._3_5_ = 0;
    binlog::SessionWriter::addEvent<boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,
               (scoped_ptr<bool> *)&local_5c8,&bshared);
    boost::checked_delete<bool>
              ((bool *)CONCAT53(local_5c8.bytesConsumed._3_5_,
                                CONCAT12(local_5c8.bytesConsumed._2_1_,
                                         (undefined2)local_5c8.bytesConsumed)));
  }
  bopt.super_type.m_initialized = true;
  bopt.super_type.m_storage = 0x7b;
  bemptyOpt.super_type.m_initialized = false;
  pSVar4 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_480._0_8_ = 0;
      local_480._8_2_ = info;
      std::__cxx11::string::string((string *)(local_480 + 0x10),"main",&local_5fc);
      std::__cxx11::string::string(local_450,"main",&local_5fa);
      std::__cxx11::string::string
                (local_430,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_5fb);
      local_410 = 0x4a;
      std::__cxx11::string::string(local_408,"Boost optionals: {} {}",&local_5f9);
      cVar7 = binlog::detail::
              concatenated_tags<char_const(&)[23],boost::optional<int>&,boost::optional<int>&>
                        ((char (*) [23])"Boost optionals: {} {}",&bopt,&bemptyOpt);
      local_5c8.bytesConsumed._0_2_ = cVar7._data._0_2_;
      local_5c8.bytesConsumed._2_1_ = cVar7._data[2];
      local_5c8.bytesConsumed._3_5_ = cVar7._data._3_5_;
      local_5c8.totalBytesConsumed._0_1_ = cVar7._data[8];
      std::__cxx11::string::string(local_3e8,(char *)&local_5c8,&local_5e9);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_480);
      binlog::EventSource::~EventSource((EventSource *)local_480);
      LOCK();
      UNLOCK();
      main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<boost::optional<int>&,boost::optional<int>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&bopt,
               &bemptyOpt);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>(&local_5c8,(binlog *)&std::cout,out);
  boost::detail::shared_count::~shared_count(&bshared.pn);
  boost::checked_delete<int>(bscoped.px);
  boost::container::dtl::basic_string_base<boost::container::new_allocator<char>_>::
  ~basic_string_base(&str.super_basic_string_base<boost::container::new_allocator<char>_>);
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<int>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::~vector_alloc_holder
            ((vector_alloc_holder<boost::container::new_allocator<int>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
              *)&bfs);
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<int,_int>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::~vector_alloc_holder
            ((vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<int,_int>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
              *)&bfm);
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
  ::~node_alloc_holder
            ((node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<int,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<int_*,_std::less<int>,_boost::move_detail::identity<int>,_bool,_true>,_bool>,_unsigned_long,_true,_void>_>
              *)&bs);
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
  ::~node_alloc_holder
            ((node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_int>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_int>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_int>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
              *)&bm);
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<int>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::~vector_alloc_holder(&bv.m_holder);
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
  ::~node_alloc_holder
            (&bsl.
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::slist_impl<boost::intrusive::bhtraits<boost::container::dtl::slist_node<int,_void_*>,_boost::intrusive::slist_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_2U>,_unsigned_long,_2UL,_void>_>
            );
  boost::container::dtl::
  node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
  ::~node_alloc_holder
            (&bl.
              super_node_alloc_holder<boost::container::new_allocator<int>,_boost::intrusive::list_impl<boost::intrusive::bhtraits<boost::container::dtl::list_node<int,_void_*>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_1U>,_unsigned_long,_true,_void>_>
            );
  boost::container::deque_base<boost::container::new_allocator<int>,_void>::~deque_base
            (&bdq.super_deque_base<boost::container::new_allocator<int>,_void>);
  return 0;
}

Assistant:

int main()
{
  // Boost containers - no specific adoption is required

  boost::container::deque<int> bdq{1,2,3};
  boost::container::list<int> bl{7,8,9};
  boost::container::slist<int> bsl{10,20,30};
  boost::container::vector<int> bv{};
  BINLOG_INFO("Boost sequence containers: {} {} {} {}", bdq, bl, bsl, bv);
  // Outputs: Boost sequence containers: [1, 2, 3] [7, 8, 9] [10, 20, 30] []

  boost::container::map<int,int> bm{{1,1},{2,4},{3,9}};
  boost::container::set<int> bs{4,5,6};
  boost::container::flat_map<int,int> bfm{{1,1},{2,4},{3,9}};
  boost::container::flat_set<int> bfs{2,3,5,8};
  BINLOG_INFO("Boost associative containers: {} {} {} {}", bm, bs, bfm, bfs);
  // Outputs: Boost associative containers: [(1, 1), (2, 4), (3, 9)] [4, 5, 6] [(1, 1), (2, 4), (3, 9)] [2, 3, 5, 8]

  // Boost string - no specific adoption is required

  boost::container::string str = "foo";
  BINLOG_INFO("Boost string: {}", str);
  // Outputs: Boost string: foo

  // Boost pointers - no specific adoption is required

  boost::scoped_ptr<int> bscoped(new int(1));
  boost::shared_ptr<int> bshared(new int(2));
  BINLOG_INFO("Boost pointers: {} {}", bscoped, bshared);
  // Outputs: Boost pointers: 1 2

  bshared.reset();
  BINLOG_INFO("Empty Boost pointers: {} {}", boost::scoped_ptr<bool>{}, bshared);
  // Outputs: Empty Boost pointers: {null} {null}

  static_assert(
    !mserialize::detail::is_serializable<boost::weak_ptr<int>>::value,
    "boost::weak_ptr is not loggable"
  );

  // Boost optional - loggable with the is_optional specialization above

  boost::optional<int> bopt(123);
  boost::optional<int> bemptyOpt;
  BINLOG_INFO("Boost optionals: {} {}", bopt, bemptyOpt);
  // Outputs: Boost optionals: 123 {null}

  binlog::consume(std::cout);
  return 0;
}